

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btMultiBodyDynamicsWorld::solveConstraints
          (btMultiBodyDynamicsWorld *this,btContactSolverInfo *solverInfo)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btScalar *pqd;
  size_t __n;
  int iVar3;
  btTypedConstraint **ptr;
  btMultiBodyConstraint **ptr_00;
  MultiBodyInplaceSolverIslandCallback *this_00;
  btConstraintSolver *pbVar4;
  btMultiBody *pbVar5;
  btMultibodyLink *pbVar6;
  undefined8 uVar7;
  int i;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  btTypedConstraint **ppbVar13;
  long lVar14;
  btMultiBodyConstraint **ppbVar15;
  undefined4 extraout_var;
  long lVar16;
  btMatrix3x3 *pbVar17;
  btScalar *pbVar18;
  float *pfVar19;
  btVector3 *pbVar20;
  ulong uVar21;
  btScalar *pbVar22;
  btScalar *pbVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  btMultiBodyDynamicsWorld *pbVar29;
  bool bVar30;
  btAlignedObjectArray<float> scratch_r;
  btAlignedObjectArray<btMatrix3x3> scratch_m;
  btAlignedObjectArray<btVector3> scratch_v;
  btAlignedObjectArray<float> scratch_r2;
  btAlignedObjectArray<float> local_130;
  btMultiBodyDynamicsWorld *local_110;
  float local_104;
  btAlignedObjectArray<btMatrix3x3> local_100;
  btAlignedObjectArray<btVector3> local_e0;
  float local_bc;
  btContactSolverInfo *local_b8;
  btScalar *local_b0;
  long local_a8;
  btAlignedObjectArray<float> local_a0;
  btAlignedObjectArray<float> local_80;
  btAlignedObjectArray<float> local_60;
  btScalar *local_40;
  long local_38;
  
  local_b8 = solverInfo;
  forwardKinematics(this);
  local_130.m_ownsMemory = true;
  local_130.m_data = (float *)0x0;
  local_130.m_size = 0;
  local_130.m_capacity = 0;
  local_e0.m_ownsMemory = true;
  local_e0.m_data = (btVector3 *)0x0;
  local_e0.m_size = 0;
  local_e0.m_capacity = 0;
  local_100.m_ownsMemory = true;
  local_100.m_data = (btMatrix3x3 *)0x0;
  local_100.m_size = 0;
  local_100.m_capacity = 0;
  CProfileManager::Start_Profile("solveConstraints");
  uVar28 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  iVar8 = (this->super_btDiscreteDynamicsWorld).m_constraints.m_size;
  if ((int)uVar28 < iVar8) {
    if ((this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_capacity < iVar8) {
      if (iVar8 == 0) {
        ppbVar13 = (btTypedConstraint **)0x0;
        uVar11 = uVar28;
      }
      else {
        ppbVar13 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar8 * 8,0x10);
        uVar11 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
      }
      if (0 < (int)uVar11) {
        uVar21 = 0;
        do {
          ppbVar13[uVar21] =
               (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
      }
      ptr = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data;
      if ((ptr != (btTypedConstraint **)0x0) &&
         ((this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_ownsMemory = true;
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data = ppbVar13;
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_capacity = iVar8;
    }
    lVar14 = (long)(int)uVar28;
    do {
      (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar14] =
           (btTypedConstraint *)0x0;
      lVar14 = lVar14 + 1;
    } while (iVar8 != lVar14);
  }
  (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size = iVar8;
  for (lVar14 = 0;
      iVar8 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
                _vptr_btCollisionWorld[0x1a])(this), lVar14 < iVar8; lVar14 = lVar14 + 1) {
    (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data[lVar14] =
         (this->super_btDiscreteDynamicsWorld).m_constraints.m_data[lVar14];
  }
  iVar8 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  if (1 < iVar8) {
    btAlignedObjectArray<btTypedConstraint_*>::quickSortInternal<btSortConstraintOnIslandPredicate2>
              (&(this->super_btDiscreteDynamicsWorld).m_sortedConstraints,
               (btSortConstraintOnIslandPredicate2 *)&local_60,0,iVar8 + -1);
  }
  iVar8 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
            _vptr_btCollisionWorld[0x1a])(this);
  if (iVar8 == 0) {
    ppbVar13 = (btTypedConstraint **)0x0;
  }
  else {
    ppbVar13 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_data;
  }
  uVar28 = (this->m_multiBodyConstraints).m_size;
  uVar11 = (this->m_sortedMultiBodyConstraints).m_size;
  uVar9 = uVar28;
  if ((int)uVar11 < (int)uVar28) {
    if ((this->m_sortedMultiBodyConstraints).m_capacity < (int)uVar28) {
      if (uVar28 == 0) {
        ppbVar15 = (btMultiBodyConstraint **)0x0;
        uVar9 = uVar11;
      }
      else {
        ppbVar15 = (btMultiBodyConstraint **)btAlignedAllocInternal((long)(int)uVar28 * 8,0x10);
        uVar9 = (this->m_sortedMultiBodyConstraints).m_size;
      }
      if (0 < (int)uVar9) {
        uVar21 = 0;
        do {
          ppbVar15[uVar21] = (this->m_sortedMultiBodyConstraints).m_data[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar9 != uVar21);
      }
      ptr_00 = (this->m_sortedMultiBodyConstraints).m_data;
      if ((ptr_00 != (btMultiBodyConstraint **)0x0) &&
         ((this->m_sortedMultiBodyConstraints).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr_00);
      }
      (this->m_sortedMultiBodyConstraints).m_ownsMemory = true;
      (this->m_sortedMultiBodyConstraints).m_data = ppbVar15;
      (this->m_sortedMultiBodyConstraints).m_capacity = uVar28;
    }
    lVar14 = (long)(int)uVar11;
    do {
      (this->m_sortedMultiBodyConstraints).m_data[lVar14] = (btMultiBodyConstraint *)0x0;
      lVar14 = lVar14 + 1;
    } while ((int)uVar28 != lVar14);
    uVar9 = (this->m_multiBodyConstraints).m_size;
  }
  (this->m_sortedMultiBodyConstraints).m_size = uVar28;
  if (0 < (int)uVar9) {
    uVar21 = 0;
    do {
      (this->m_sortedMultiBodyConstraints).m_data[uVar21] =
           (this->m_multiBodyConstraints).m_data[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar9 != uVar21);
  }
  if (1 < (int)uVar28) {
    btAlignedObjectArray<btMultiBodyConstraint_*>::
    quickSortInternal<btSortMultiBodyConstraintOnIslandPredicate>
              (&this->m_sortedMultiBodyConstraints,
               (btSortMultiBodyConstraintOnIslandPredicate *)&local_60,0,uVar28 - 1);
    uVar28 = (this->m_sortedMultiBodyConstraints).m_size;
  }
  ppbVar15 = (this->m_sortedMultiBodyConstraints).m_data;
  this_00 = this->m_solverMultiBodyIslandCallback;
  iVar8 = (this->super_btDiscreteDynamicsWorld).m_sortedConstraints.m_size;
  local_110 = this;
  iVar10 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             _vptr_btCollisionWorld[5])();
  if (uVar28 == 0) {
    ppbVar15 = (btMultiBodyConstraint **)0x0;
  }
  MultiBodyInplaceSolverIslandCallback::setup
            (this_00,local_b8,ppbVar13,iVar8,ppbVar15,uVar28,
             (btIDebugDraw *)CONCAT44(extraout_var,iVar10));
  pbVar4 = (local_110->super_btDiscreteDynamicsWorld).m_constraintSolver;
  uVar28 = (local_110->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
           m_collisionObjects.m_size;
  uVar11 = (*((local_110->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
              super_btCollisionWorld.m_dispatcher1)->_vptr_btDispatcher[9])();
  (*pbVar4->_vptr_btConstraintSolver[2])(pbVar4,(ulong)uVar28,(ulong)uVar11);
  btSimulationIslandManager::buildAndProcessIslands
            ((local_110->super_btDiscreteDynamicsWorld).m_islandManager,
             (local_110->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld
             .m_dispatcher1,(btCollisionWorld *)local_110,
             &local_110->m_solverMultiBodyIslandCallback->super_IslandCallback);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  pbVar29 = local_110;
  if (0 < (local_110->m_multiBodies).m_size) {
    lVar14 = 0;
    do {
      pbVar5 = (pbVar29->m_multiBodies).m_data[lVar14];
      if (pbVar5->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar30 = false;
      }
      else {
        bVar30 = *(int *)(pbVar5->m_baseCollider + 0xec) == 2;
      }
      iVar8 = (pbVar5->m_links).m_size;
      lVar16 = (long)iVar8;
      if (0 < lVar16) {
        lVar26 = 0;
        do {
          lVar25 = *(long *)((long)((pbVar5->m_links).m_data)->m_jointTorque + lVar26 + 0x1c);
          if (lVar25 != 0) {
            bVar30 = (bool)(bVar30 | *(int *)(lVar25 + 0xec) == 2);
          }
          lVar26 = lVar26 + 600;
        } while (lVar16 * 600 - lVar26 != 0);
      }
      local_38 = lVar14;
      if (!bVar30) {
        uVar21 = lVar16 + 1;
        iVar10 = local_130.m_size;
        iVar12 = (int)uVar21;
        if (iVar8 < local_130.m_size) {
          uVar21 = uVar21 & 0xffffffff;
        }
        else {
          if (local_130.m_capacity <= iVar8) {
            if (iVar12 == 0) {
              pfVar19 = (float *)0x0;
            }
            else {
              pfVar19 = (float *)btAlignedAllocInternal(uVar21 * 4,0x10);
            }
            if (local_130.m_size < 1) {
              if (local_130.m_data != (float *)0x0) goto LAB_001c40f7;
            }
            else {
              uVar21 = 0;
              do {
                pfVar19[uVar21] = local_130.m_data[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uint)local_130.m_size != uVar21);
LAB_001c40f7:
              if (local_130.m_ownsMemory == true) {
                btAlignedFreeInternal(local_130.m_data);
              }
            }
            local_130.m_ownsMemory = true;
            local_130.m_capacity = iVar12;
            local_130.m_data = pfVar19;
          }
          memset(local_130.m_data + iVar10,0,((long)iVar12 - (long)iVar10) * 4);
          iVar8 = (pbVar5->m_links).m_size;
          uVar21 = (ulong)(iVar8 + 1);
        }
        local_130.m_size = iVar12;
        uVar11 = (uint)uVar21;
        uVar28 = uVar11;
        if (local_e0.m_size <= iVar8) {
          if (local_e0.m_capacity <= iVar8) {
            if (uVar11 == 0) {
              pbVar20 = (btVector3 *)0x0;
            }
            else {
              pbVar20 = (btVector3 *)btAlignedAllocInternal((long)(int)uVar11 << 4,0x10);
            }
            if (0 < local_e0.m_size) {
              lVar14 = 0;
              do {
                puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar14);
                uVar7 = puVar1[1];
                puVar2 = (undefined8 *)((long)pbVar20->m_floats + lVar14);
                *puVar2 = *puVar1;
                puVar2[1] = uVar7;
                lVar14 = lVar14 + 0x10;
              } while ((ulong)(uint)local_e0.m_size << 4 != lVar14);
            }
            if ((local_e0.m_data != (btVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_e0.m_data);
            }
            local_e0.m_ownsMemory = true;
            local_e0._4_8_ = uVar21 << 0x20;
            local_e0.m_data = pbVar20;
          }
          iVar8 = (pbVar5->m_links).m_size;
          uVar28 = iVar8 + 1;
        }
        local_e0.m_size = uVar11;
        if ((local_100.m_size <= iVar8) && (local_100.m_capacity <= iVar8)) {
          if (uVar28 == 0) {
            pbVar17 = (btMatrix3x3 *)0x0;
          }
          else {
            pbVar17 = (btMatrix3x3 *)btAlignedAllocInternal((long)(int)uVar28 * 0x30,0x10);
          }
          if (0 < local_100.m_size) {
            lVar14 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[0].m_floats + lVar14);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar17->m_el[0].m_floats + lVar14);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[1].m_floats + lVar14);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar17->m_el[1].m_floats + lVar14);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar2 = (undefined8 *)((long)(local_100.m_data)->m_el[2].m_floats + lVar14);
              uVar7 = puVar2[1];
              puVar1 = (undefined8 *)((long)pbVar17->m_el[2].m_floats + lVar14);
              *puVar1 = *puVar2;
              puVar1[1] = uVar7;
              lVar14 = lVar14 + 0x30;
            } while ((ulong)(uint)local_100.m_size * 0x30 != lVar14);
          }
          if ((local_100.m_data != (btMatrix3x3 *)0x0) && (local_100.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_100.m_data);
          }
          local_100.m_ownsMemory = true;
          local_100._4_8_ = (ulong)uVar28 << 0x20;
          local_100.m_data = pbVar17;
        }
        local_100.m_size = uVar28;
        if (pbVar5->m_useRK4 == false) {
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,(local_b8->super_btContactSolverInfoData).m_timeStep,&local_130,
                     &local_e0,&local_100,false);
        }
        else {
          iVar8 = pbVar5->m_dofCount;
          lVar16 = (long)iVar8;
          uVar21 = lVar16 + 6;
          local_a8 = (long)pbVar5->m_posVarCnt;
          lVar14 = local_a8 + 7;
          local_60.m_ownsMemory = true;
          local_60.m_data = (float *)0x0;
          local_60.m_size = 0;
          local_60.m_capacity = 0;
          iVar10 = (int)uVar21;
          uVar28 = iVar10 * 8 + (int)lVar14 * 2;
          pbVar18 = (btScalar *)btAlignedAllocInternal((ulong)uVar28 * 4,0x10);
          if ((long)local_60.m_size < 1) {
            if (local_60.m_data != (float *)0x0) goto LAB_001c4336;
          }
          else {
            lVar26 = 0;
            do {
              pbVar18[lVar26] = local_60.m_data[lVar26];
              lVar26 = lVar26 + 1;
            } while (local_60.m_size != lVar26);
LAB_001c4336:
            if (local_60.m_ownsMemory == true) {
              btAlignedFreeInternal(local_60.m_data);
            }
          }
          local_60.m_ownsMemory = true;
          local_60.m_data = pbVar18;
          local_60.m_capacity = uVar28;
          memset(pbVar18,0,(ulong)uVar28 * 4);
          local_60.m_size = uVar28;
          *pbVar18 = (pbVar5->m_baseQuat).super_btQuadWord.m_floats[0];
          pbVar18[1] = (pbVar5->m_baseQuat).super_btQuadWord.m_floats[1];
          pbVar18[2] = (pbVar5->m_baseQuat).super_btQuadWord.m_floats[2];
          pbVar18[3] = (pbVar5->m_baseQuat).super_btQuadWord.m_floats[3];
          pbVar18[4] = (pbVar5->m_basePos).m_floats[0];
          pbVar18[5] = (pbVar5->m_basePos).m_floats[1];
          pbVar18[6] = (pbVar5->m_basePos).m_floats[2];
          lVar26 = (long)(pbVar5->m_links).m_size;
          if (0 < lVar26) {
            pbVar6 = (pbVar5->m_links).m_data;
            pbVar23 = pbVar6->m_jointPos;
            lVar25 = 0;
            do {
              iVar12 = pbVar6[lVar25].m_posVarCount;
              if (0 < (long)iVar12) {
                iVar3 = pbVar6[lVar25].m_cfgOffset;
                lVar27 = 0;
                do {
                  pbVar18[iVar3 + 7 + (int)lVar27] = pbVar23[lVar27];
                  lVar27 = lVar27 + 1;
                } while (iVar12 != lVar27);
              }
              lVar25 = lVar25 + 1;
              pbVar23 = pbVar23 + 0x96;
            } while (lVar25 != lVar26);
          }
          pbVar23 = pbVar18 + lVar14;
          local_b0 = pbVar23 + lVar14;
          if (-6 < iVar8) {
            pfVar19 = (pbVar5->m_realBuf).m_data;
            uVar24 = 0;
            do {
              local_b0[uVar24] = pfVar19[uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          local_104 = (local_b8->super_btContactSolverInfoData).m_timeStep;
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,0.0,&local_130,&local_e0,&local_100,false);
          pqd = local_b0 + uVar21;
          pbVar22 = pqd + uVar21;
          if (-6 < iVar8) {
            iVar12 = pbVar5->m_dofCount;
            uVar24 = 0;
            do {
              pbVar22[uVar21 * 2 + uVar24] = local_130.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar5->m_posVarCnt) {
            iVar12 = pbVar5->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar23[uVar24] = pbVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          local_bc = local_104 * 0.5;
          local_40 = pbVar22;
          btMultiBody::stepPositionsMultiDof(pbVar5,local_bc,pbVar23,local_b0);
          if (-6 < iVar8) {
            uVar24 = 0;
            do {
              pqd[uVar24] = pbVar22[uVar21 * 2 + uVar24] * local_bc +
                            pbVar18[local_a8 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar5->m_dofCount) {
            pfVar19 = (pbVar5->m_realBuf).m_data;
            iVar12 = pbVar5->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar19[uVar24] = pqd[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,0.0,&local_130,&local_e0,&local_100,false);
          if (-6 < iVar8) {
            iVar12 = pbVar5->m_dofCount;
            uVar24 = 0;
            do {
              pbVar22[uVar21 * 3 + uVar24] = local_130.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar5->m_posVarCnt) {
            iVar12 = pbVar5->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar23[uVar24] = pbVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::stepPositionsMultiDof(pbVar5,local_bc,pbVar23,pqd);
          if (-6 < iVar8) {
            uVar24 = 0;
            do {
              pbVar18[local_a8 * 2 + lVar16 * 2 + uVar24 + 0x1a] =
                   pbVar22[uVar21 * 3 + uVar24] * local_bc + pbVar18[local_a8 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar5->m_dofCount) {
            pfVar19 = (pbVar5->m_realBuf).m_data;
            iVar12 = pbVar5->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar19[uVar24] = pbVar18[local_a8 * 2 + lVar16 * 2 + uVar24 + 0x1a];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,0.0,&local_130,&local_e0,&local_100,false);
          if (-6 < iVar8) {
            iVar12 = pbVar5->m_dofCount;
            uVar24 = 0;
            do {
              pbVar22[uVar21 * 4 + uVar24] = local_130.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-7 < pbVar5->m_posVarCnt) {
            iVar12 = pbVar5->m_posVarCnt + 6;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pbVar23[uVar24] = pbVar18[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::stepPositionsMultiDof(pbVar5,local_104,pbVar23,local_40);
          if (-6 < iVar8) {
            uVar24 = 0;
            do {
              pbVar22[uVar21 + uVar24] =
                   pbVar22[uVar21 * 4 + uVar24] * local_104 + pbVar18[local_a8 * 2 + uVar24 + 0xe];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          if (-6 < pbVar5->m_dofCount) {
            pfVar19 = (pbVar5->m_realBuf).m_data;
            iVar12 = pbVar5->m_dofCount + 5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            uVar24 = 0;
            do {
              pfVar19[uVar24] = pbVar22[uVar21 + uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar12 + 1 != uVar24);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,0.0,&local_130,&local_e0,&local_100,false);
          if (iVar8 < -5) {
            local_a0.m_ownsMemory = true;
            local_a0.m_data = (float *)0x0;
            local_a0._4_8_ = uVar21 & 0xffffffff;
            local_80.m_ownsMemory = true;
            local_80.m_data = (btScalar *)0x0;
            local_80._4_8_ = uVar21 & 0xffffffff;
            pbVar18 = (btScalar *)0x0;
            pbVar29 = local_110;
          }
          else {
            iVar12 = pbVar5->m_dofCount;
            uVar24 = 0;
            do {
              pbVar22[uVar21 * 5 + uVar24] = local_130.m_data[(long)iVar12 + uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
            local_a0.m_ownsMemory = true;
            local_a0.m_data = (float *)0x0;
            local_a0.m_size = 0;
            local_a0.m_capacity = 0;
            pfVar19 = (float *)btAlignedAllocInternal(uVar21 * 4,0x10);
            if ((long)local_a0.m_size < 1) {
              if (local_a0.m_data != (float *)0x0) goto LAB_001c4963;
            }
            else {
              lVar14 = 0;
              do {
                pfVar19[lVar14] = local_a0.m_data[lVar14];
                lVar14 = lVar14 + 1;
              } while (local_a0.m_size != lVar14);
LAB_001c4963:
              if (local_a0.m_ownsMemory == true) {
                btAlignedFreeInternal(local_a0.m_data);
              }
            }
            local_a0.m_ownsMemory = true;
            __n = lVar16 * 4 + 0x18;
            local_a0.m_data = pfVar19;
            local_a0.m_capacity = iVar10;
            memset(pfVar19,0,__n);
            local_a0.m_size = iVar10;
            local_80.m_ownsMemory = true;
            local_80.m_data = (float *)0x0;
            local_80.m_size = 0;
            local_80.m_capacity = 0;
            pbVar18 = (btScalar *)btAlignedAllocInternal(uVar21 * 4,0x10);
            pbVar29 = local_110;
            if ((long)local_80.m_size < 1) {
              if (local_80.m_data != (float *)0x0) goto LAB_001c4a0c;
            }
            else {
              lVar14 = 0;
              do {
                pbVar18[lVar14] = local_80.m_data[lVar14];
                lVar14 = lVar14 + 1;
              } while (local_80.m_size != lVar14);
LAB_001c4a0c:
              if (local_80.m_ownsMemory == true) {
                btAlignedFreeInternal(local_80.m_data);
              }
            }
            local_80.m_ownsMemory = true;
            local_80.m_data = pbVar18;
            local_80.m_capacity = iVar10;
            memset(pbVar18,0,__n);
            local_80.m_size = iVar10;
            if (-6 < iVar8) {
              uVar24 = 0;
              do {
                pfVar19 = local_b0 + uVar24;
                local_a0.m_data[uVar24] =
                     (pfVar19[lVar16 * 2 + 0xc] + pfVar19[lVar16 * 2 + 0xc] +
                      pfVar19[lVar16 + 6] + pfVar19[lVar16 + 6] + *pfVar19 +
                     pfVar19[lVar16 * 3 + 0x12]) * (local_104 / 6.0);
                pbVar18[uVar24] =
                     (pfVar19[lVar16 * 6 + 0x24] + pfVar19[lVar16 * 6 + 0x24] +
                      pfVar19[lVar16 * 5 + 0x1e] + pfVar19[lVar16 * 5 + 0x1e] +
                      pfVar19[lVar16 * 4 + 0x18] + pfVar19[lVar16 * 7 + 0x2a]) * (local_104 / 6.0);
                uVar24 = uVar24 + 1;
              } while ((uVar21 & 0xffffffff) != uVar24);
            }
          }
          if (-6 < pbVar5->m_dofCount) {
            pfVar19 = (pbVar5->m_realBuf).m_data;
            iVar10 = pbVar5->m_dofCount + 5;
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            uVar24 = 0;
            do {
              pfVar19[uVar24] = local_b0[uVar24];
              uVar24 = uVar24 + 1;
            } while (iVar10 + 1 != uVar24);
          }
          btMultiBody::applyDeltaVeeMultiDof(pbVar5,pbVar18,1.0);
          if (-6 < iVar8) {
            iVar8 = pbVar5->m_dofCount;
            pfVar19 = (pbVar5->m_realBuf).m_data;
            uVar24 = 0;
            do {
              pfVar19[(long)(iVar8 + iVar8 * iVar8 + 6) + uVar24] = local_a0.m_data[uVar24];
              uVar24 = uVar24 + 1;
            } while ((uVar21 & 0xffffffff) != uVar24);
          }
          pbVar5->__posUpdated = true;
          if (0 < (pbVar5->m_links).m_size) {
            lVar14 = 0;
            lVar16 = 0;
            do {
              btMultibodyLink::updateCacheMultiDof
                        ((btMultibodyLink *)
                         ((long)(((pbVar5->m_links).m_data)->m_inertiaLocal).m_floats + lVar14 + -4)
                         ,(btScalar *)0x0);
              lVar16 = lVar16 + 1;
              lVar14 = lVar14 + 600;
            } while (lVar16 < (pbVar5->m_links).m_size);
          }
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,0.0,&local_130,&local_e0,&local_100,false);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_80);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_a0);
          btAlignedObjectArray<float>::~btAlignedObjectArray(&local_60);
        }
      }
      lVar14 = local_38 + 1;
    } while (lVar14 < (pbVar29->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  (*(pbVar29->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
    _vptr_btCollisionWorld[0x38])(pbVar29);
  MultiBodyInplaceSolverIslandCallback::processConstraints
            (local_110->m_solverMultiBodyIslandCallback);
  pbVar4 = (local_110->super_btDiscreteDynamicsWorld).m_constraintSolver;
  (*pbVar4->_vptr_btConstraintSolver[4])
            (pbVar4,local_b8,
             (local_110->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld
             .m_debugDrawer);
  CProfileManager::Start_Profile("btMultiBody stepVelocities");
  if (0 < (local_110->m_multiBodies).m_size) {
    lVar14 = 0;
    do {
      pbVar5 = (local_110->m_multiBodies).m_data[lVar14];
      if (pbVar5->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar30 = false;
      }
      else {
        bVar30 = *(int *)(pbVar5->m_baseCollider + 0xec) == 2;
      }
      iVar8 = (pbVar5->m_links).m_size;
      lVar16 = (long)iVar8;
      if (0 < lVar16) {
        lVar26 = 0;
        do {
          lVar25 = *(long *)((long)((pbVar5->m_links).m_data)->m_jointTorque + lVar26 + 0x1c);
          if (lVar25 != 0) {
            bVar30 = (bool)(bVar30 | *(int *)(lVar25 + 0xec) == 2);
          }
          lVar26 = lVar26 + 600;
        } while (lVar16 * 600 - lVar26 != 0);
      }
      if (!bVar30) {
        iVar10 = local_130.m_size;
        uVar11 = (uint)(lVar16 + 1);
        uVar28 = uVar11;
        if (local_130.m_size <= iVar8) {
          if (local_130.m_capacity <= iVar8) {
            if (uVar11 == 0) {
              pfVar19 = (float *)0x0;
            }
            else {
              pfVar19 = (float *)btAlignedAllocInternal((lVar16 + 1) * 4,0x10);
            }
            if (local_130.m_size < 1) {
              if (local_130.m_data != (float *)0x0) goto LAB_001c4d77;
            }
            else {
              uVar21 = 0;
              do {
                pfVar19[uVar21] = local_130.m_data[uVar21];
                uVar21 = uVar21 + 1;
              } while ((uint)local_130.m_size != uVar21);
LAB_001c4d77:
              if (local_130.m_ownsMemory == true) {
                btAlignedFreeInternal(local_130.m_data);
              }
            }
            local_130.m_ownsMemory = true;
            local_130.m_capacity = uVar11;
            local_130.m_data = pfVar19;
          }
          memset(local_130.m_data + iVar10,0,((long)(int)uVar11 - (long)iVar10) * 4);
          iVar8 = (pbVar5->m_links).m_size;
          uVar28 = iVar8 + 1;
        }
        local_130.m_size = uVar11;
        uVar11 = uVar28;
        if (local_e0.m_size <= iVar8) {
          if (local_e0.m_capacity <= iVar8) {
            if (uVar28 == 0) {
              pbVar20 = (btVector3 *)0x0;
            }
            else {
              pbVar20 = (btVector3 *)btAlignedAllocInternal((long)(int)uVar28 << 4,0x10);
            }
            if (0 < local_e0.m_size) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar16);
                uVar7 = puVar1[1];
                puVar2 = (undefined8 *)((long)pbVar20->m_floats + lVar16);
                *puVar2 = *puVar1;
                puVar2[1] = uVar7;
                lVar16 = lVar16 + 0x10;
              } while ((ulong)(uint)local_e0.m_size << 4 != lVar16);
            }
            if ((local_e0.m_data != (btVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
              btAlignedFreeInternal(local_e0.m_data);
            }
            local_e0.m_ownsMemory = true;
            local_e0._4_8_ = (ulong)uVar28 << 0x20;
            local_e0.m_data = pbVar20;
          }
          iVar8 = (pbVar5->m_links).m_size;
          uVar11 = iVar8 + 1;
        }
        local_e0.m_size = uVar28;
        if ((local_100.m_size <= iVar8) && (local_100.m_capacity <= iVar8)) {
          if (uVar11 == 0) {
            pbVar17 = (btMatrix3x3 *)0x0;
          }
          else {
            pbVar17 = (btMatrix3x3 *)btAlignedAllocInternal((long)(int)uVar11 * 0x30,0x10);
          }
          if (0 < local_100.m_size) {
            lVar16 = 0;
            do {
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[0].m_floats + lVar16);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar17->m_el[0].m_floats + lVar16);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar1 = (undefined8 *)((long)(local_100.m_data)->m_el[1].m_floats + lVar16);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)pbVar17->m_el[1].m_floats + lVar16);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              puVar2 = (undefined8 *)((long)(local_100.m_data)->m_el[2].m_floats + lVar16);
              uVar7 = puVar2[1];
              puVar1 = (undefined8 *)((long)pbVar17->m_el[2].m_floats + lVar16);
              *puVar1 = *puVar2;
              puVar1[1] = uVar7;
              lVar16 = lVar16 + 0x30;
            } while ((local_100._4_8_ & 0xffffffff) * 0x30 != lVar16);
          }
          if ((local_100.m_data != (btMatrix3x3 *)0x0) && (local_100.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_100.m_data);
          }
          local_100.m_ownsMemory = true;
          local_100._4_8_ = (ulong)uVar11 << 0x20;
          local_100.m_data = pbVar17;
        }
        local_100.m_size = uVar11;
        if (pbVar5->m_useRK4 == false) {
          btMultiBody::computeAccelerationsArticulatedBodyAlgorithmMultiDof
                    (pbVar5,(local_b8->super_btContactSolverInfoData).m_timeStep,&local_130,
                     &local_e0,&local_100,true);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (local_110->m_multiBodies).m_size);
  }
  pbVar29 = local_110;
  CProfileManager::Stop_Profile();
  if (0 < (pbVar29->m_multiBodies).m_size) {
    lVar14 = 0;
    do {
      btMultiBody::processDeltaVeeMultiDof2((pbVar29->m_multiBodies).m_data[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < (pbVar29->m_multiBodies).m_size);
  }
  CProfileManager::Stop_Profile();
  btAlignedObjectArray<btMatrix3x3>::~btAlignedObjectArray(&local_100);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_e0);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_130);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::solveConstraints(btContactSolverInfo& solverInfo)
{
	forwardKinematics();

	btAlignedObjectArray<btScalar> scratch_r;
	btAlignedObjectArray<btVector3> scratch_v;
	btAlignedObjectArray<btMatrix3x3> scratch_m;


	BT_PROFILE("solveConstraints");
	
	m_sortedConstraints.resize( m_constraints.size());
	int i; 
	for (i=0;i<getNumConstraints();i++)
	{
		m_sortedConstraints[i] = m_constraints[i];
	}
	m_sortedConstraints.quickSort(btSortConstraintOnIslandPredicate2());
	btTypedConstraint** constraintsPtr = getNumConstraints() ? &m_sortedConstraints[0] : 0;

	m_sortedMultiBodyConstraints.resize(m_multiBodyConstraints.size());
	for (i=0;i<m_multiBodyConstraints.size();i++)
	{
		m_sortedMultiBodyConstraints[i] = m_multiBodyConstraints[i];
	}
	m_sortedMultiBodyConstraints.quickSort(btSortMultiBodyConstraintOnIslandPredicate());

	btMultiBodyConstraint** sortedMultiBodyConstraints = m_sortedMultiBodyConstraints.size() ?  &m_sortedMultiBodyConstraints[0] : 0;
	

	m_solverMultiBodyIslandCallback->setup(&solverInfo,constraintsPtr,m_sortedConstraints.size(),sortedMultiBodyConstraints,m_sortedMultiBodyConstraints.size(), getDebugDrawer());
	m_constraintSolver->prepareSolve(getCollisionWorld()->getNumCollisionObjects(), getCollisionWorld()->getDispatcher()->getNumManifolds());
	
	/// solve all the constraints for this island
	m_islandManager->buildAndProcessIslands(getCollisionWorld()->getDispatcher(),getCollisionWorld(),m_solverMultiBodyIslandCallback);

#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	{
		BT_PROFILE("btMultiBody addForce");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);

				bod->addBaseForce(m_gravity * bod->getBaseMass());

				for (int j = 0; j < bod->getNumLinks(); ++j) 
				{
					bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
				}
			}//if (!isSleeping)
		}
	}
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
	

	{
		BT_PROFILE("btMultiBody stepVelocities");
		for (int i=0;i<this->m_multiBodies.size();i++)
		{
			btMultiBody* bod = m_multiBodies[i];

			bool isSleeping = false;
			
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			} 

			if (!isSleeping)
			{
				//useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
				scratch_r.resize(bod->getNumLinks()+1);			//multidof? ("Y"s use it and it is used to store qdd)
				scratch_v.resize(bod->getNumLinks()+1);
				scratch_m.resize(bod->getNumLinks()+1);
				bool doNotUpdatePos = false;

				{
					if(!bod->isUsingRK4Integration())
					{
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m);
					}
					else
					{						
						//
						int numDofs = bod->getNumDofs() + 6;
						int numPosVars = bod->getNumPosVars() + 7;
						btAlignedObjectArray<btScalar> scratch_r2; scratch_r2.resize(2*numPosVars + 8*numDofs);
						//convenience
						btScalar *pMem = &scratch_r2[0];
						btScalar *scratch_q0 = pMem; pMem += numPosVars;
						btScalar *scratch_qx = pMem; pMem += numPosVars;
						btScalar *scratch_qd0 = pMem; pMem += numDofs;
						btScalar *scratch_qd1 = pMem; pMem += numDofs;
						btScalar *scratch_qd2 = pMem; pMem += numDofs;
						btScalar *scratch_qd3 = pMem; pMem += numDofs;
						btScalar *scratch_qdd0 = pMem; pMem += numDofs;
						btScalar *scratch_qdd1 = pMem; pMem += numDofs;
						btScalar *scratch_qdd2 = pMem; pMem += numDofs;
						btScalar *scratch_qdd3 = pMem; pMem += numDofs;
						btAssert((pMem - (2*numPosVars + 8*numDofs)) == &scratch_r2[0]);

						/////						
						//copy q0 to scratch_q0 and qd0 to scratch_qd0
						scratch_q0[0] = bod->getWorldToBaseRot().x();
						scratch_q0[1] = bod->getWorldToBaseRot().y();
						scratch_q0[2] = bod->getWorldToBaseRot().z();
						scratch_q0[3] = bod->getWorldToBaseRot().w();
						scratch_q0[4] = bod->getBasePos().x();
						scratch_q0[5] = bod->getBasePos().y();
						scratch_q0[6] = bod->getBasePos().z();
						//
						for(int link = 0; link < bod->getNumLinks(); ++link)
						{
							for(int dof = 0; dof < bod->getLink(link).m_posVarCount; ++dof)
								scratch_q0[7 + bod->getLink(link).m_cfgOffset + dof] = bod->getLink(link).m_jointPos[dof];							
						}
						//
						for(int dof = 0; dof < numDofs; ++dof)								
							scratch_qd0[dof] = bod->getVelocityVector()[dof];
						////
						struct
						{
						    btMultiBody *bod;
                            btScalar *scratch_qx, *scratch_q0;

						    void operator()()
						    {
						        for(int dof = 0; dof < bod->getNumPosVars() + 7; ++dof)
                                    scratch_qx[dof] = scratch_q0[dof];
						    }
						} pResetQx = {bod, scratch_qx, scratch_q0};
						//
						struct
						{
						    void operator()(btScalar dt, const btScalar *pDer, const btScalar *pCurVal, btScalar *pVal, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pVal[i] = pCurVal[i] + dt * pDer[i];
						    }

						} pEulerIntegrate;
						//
						struct
                        {
                            void operator()(btMultiBody *pBody, const btScalar *pData)
                            {
                                btScalar *pVel = const_cast<btScalar*>(pBody->getVelocityVector());

                                for(int i = 0; i < pBody->getNumDofs() + 6; ++i)
                                    pVel[i] = pData[i];

                            }
                        } pCopyToVelocityVector;
						//
                        struct
						{
						    void operator()(const btScalar *pSrc, btScalar *pDst, int start, int size)
						    {
						        for(int i = 0; i < size; ++i)
                                    pDst[i] = pSrc[start + i];
						    }
						} pCopy;
						//

						btScalar h = solverInfo.m_timeStep;
						#define output &scratch_r[bod->getNumDofs()]
						//calc qdd0 from: q0 & qd0	
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd0, 0, numDofs);
						//calc q1 = q0 + h/2 * qd0
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd0);
						//calc qd1 = qd0 + h/2 * qdd0
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd0, scratch_qd0, scratch_qd1, numDofs);
						//
						//calc qdd1 from: q1 & qd1
						pCopyToVelocityVector(bod, scratch_qd1);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd1, 0, numDofs);
						//calc q2 = q0 + h/2 * qd1
						pResetQx();
						bod->stepPositionsMultiDof(btScalar(.5)*h, scratch_qx, scratch_qd1);
						//calc qd2 = qd0 + h/2 * qdd1
						pEulerIntegrate(btScalar(.5)*h, scratch_qdd1, scratch_qd0, scratch_qd2, numDofs);
						//
						//calc qdd2 from: q2 & qd2
						pCopyToVelocityVector(bod, scratch_qd2);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd2, 0, numDofs);
						//calc q3 = q0 + h * qd2
						pResetQx();
						bod->stepPositionsMultiDof(h, scratch_qx, scratch_qd2);
						//calc qd3 = qd0 + h * qdd2
						pEulerIntegrate(h, scratch_qdd2, scratch_qd0, scratch_qd3, numDofs);
						//
						//calc qdd3 from: q3 & qd3
						pCopyToVelocityVector(bod, scratch_qd3);
						bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0., scratch_r, scratch_v, scratch_m);
						pCopy(output, scratch_qdd3, 0, numDofs);

						//
						//calc q = q0 + h/6(qd0 + 2*(qd1 + qd2) + qd3)
						//calc qd = qd0 + h/6(qdd0 + 2*(qdd1 + qdd2) + qdd3)						
						btAlignedObjectArray<btScalar> delta_q; delta_q.resize(numDofs);
						btAlignedObjectArray<btScalar> delta_qd; delta_qd.resize(numDofs);
						for(int i = 0; i < numDofs; ++i)
						{
							delta_q[i] = h/btScalar(6.)*(scratch_qd0[i] + 2*scratch_qd1[i] + 2*scratch_qd2[i] + scratch_qd3[i]);
							delta_qd[i] = h/btScalar(6.)*(scratch_qdd0[i] + 2*scratch_qdd1[i] + 2*scratch_qdd2[i] + scratch_qdd3[i]);							
							//delta_q[i] = h*scratch_qd0[i];
							//delta_qd[i] = h*scratch_qdd0[i];
						}
						//
						pCopyToVelocityVector(bod, scratch_qd0);
						bod->applyDeltaVeeMultiDof(&delta_qd[0], 1);						
						//
						if(!doNotUpdatePos)
						{
							btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
							pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

							for(int i = 0; i < numDofs; ++i)
								pRealBuf[i] = delta_q[i];

							//bod->stepPositionsMultiDof(1, 0, &delta_q[0]);
							bod->setPosUpdated(true);							
						}

						//ugly hack which resets the cached data to t0 (needed for constraint solver)
						{
							for(int link = 0; link < bod->getNumLinks(); ++link)
								bod->getLink(link).updateCacheMultiDof();
							bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(0, scratch_r, scratch_v, scratch_m);
						}
						
					}
				}
				
#ifndef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
				bod->clearForcesAndTorques();
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
			}//if (!isSleeping)
		}
	}

	clearMultiBodyConstraintForces();

	m_solverMultiBodyIslandCallback->processConstraints();
	
	m_constraintSolver->allSolved(solverInfo, m_debugDrawer);

	{
                BT_PROFILE("btMultiBody stepVelocities");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                                //useless? they get resized in stepVelocities once again (AND DIFFERENTLY)
                                scratch_r.resize(bod->getNumLinks()+1);                 //multidof? ("Y"s use it and it is used to store qdd)
                                scratch_v.resize(bod->getNumLinks()+1);
                                scratch_m.resize(bod->getNumLinks()+1);

                                
                            {
                                if(!bod->isUsingRK4Integration())
                                {
									bool isConstraintPass = true;
                                    bod->computeAccelerationsArticulatedBodyAlgorithmMultiDof(solverInfo.m_timeStep, scratch_r, scratch_v, scratch_m, isConstraintPass);
                                }
				}
			}
		}
	}

	for (int i=0;i<this->m_multiBodies.size();i++)
	{
		btMultiBody* bod = m_multiBodies[i];
		bod->processDeltaVeeMultiDof2();
	}

}